

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paper_example_reverse.c
# Opt level: O1

int reverse(int x)

{
  bsp_pid_t bVar1;
  uint uVar2;
  int in_EDI;
  int local_14;
  
  local_14 = in_EDI;
  bsp_push_reg(&local_14,4);
  bsp_sync();
  bVar1 = bsp_nprocs();
  uVar2 = bsp_pid();
  bsp_put(bVar1 + ~uVar2,&local_14,&local_14,0,4);
  bsp_pop_reg(&local_14);
  bsp_sync();
  return local_14;
}

Assistant:

int reverse( int x )
{
    bsp_push_reg( &x, sizeof(x) );
    bsp_sync();

    bsp_put( bsp_nprocs() - bsp_pid() - 1, &x, &x, 0, sizeof(x) );
    bsp_pop_reg(&x);
    bsp_sync();
    return x;
}